

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

TValue * cpcparser(lua_State *L,lua_CFunction dummy,void *ud)

{
  BCLine hashline;
  byte *pbVar1;
  CTState *cts;
  long lVar2;
  undefined1 uVar3;
  char cVar4;
  uint uVar5;
  CTypeID CVar6;
  int iVar7;
  CPToken CVar8;
  CPscl CVar9;
  CTypeID id;
  ulong uVar10;
  ErrMsg em;
  long lVar11;
  int iVar12;
  CType *ct;
  CPDecl decl;
  CType *local_6c8;
  int local_6bc;
  CType *local_6b8;
  CPDecl local_6b0;
  
  *(undefined4 *)((long)L->cframe + 0x14) = 0xffffffff;
  *(undefined8 *)((long)ud + 0x58) = 1;
  *(undefined1 *)((long)ud + 0x6f) = 0;
  *(undefined1 *)((long)ud + 0x68) = 0xff;
  *(undefined4 *)((long)ud + 0x34) = *(undefined4 *)((long)ud + 0x38);
  *(undefined8 *)((long)ud + 0x28) = 0;
  *(undefined4 *)((long)ud + 0x30) = 0;
  pbVar1 = *(byte **)((long)ud + 0x20);
  *(byte **)((long)ud + 0x20) = pbVar1 + 1;
  uVar5 = (uint)*pbVar1;
  *(uint *)ud = uVar5;
  if (uVar5 == 0x5c) {
    cp_get_bs((CPState *)ud);
  }
  *(undefined4 *)((long)ud + 4) = 0;
  *(undefined4 *)((long)ud + 0x60) = 0x38c0;
  cp_next((CPState *)ud);
  if ((*(byte *)((long)ud + 100) & 1) == 0) {
    cp_decl_spec((CPState *)ud,&local_6b0,0);
    cp_declarator((CPState *)ud,&local_6b0);
    CVar6 = cp_decl_intern((CPState *)ud,&local_6b0);
    *(CTypeID *)((long)ud + 0xc) = CVar6;
    if (*(int *)((long)ud + 4) != 0x103) {
      cp_err_token((CPState *)ud,0x103);
    }
  }
  else {
    iVar7 = *(int *)((long)ud + 4);
    if (iVar7 != 0x103) {
      iVar12 = 1;
      do {
        if (iVar7 == 0x23) {
          hashline = *(BCLine *)((long)ud + 0x58);
          CVar8 = cp_next((CPState *)ud);
          if (CVar8 == 0x100) {
            lVar2 = *(long *)((long)ud + 0x10);
            if (*(int *)(lVar2 + 0xc) == 6) {
              if (*(short *)(lVar2 + 0x14) != 0x616d || *(int *)(lVar2 + 0x10) != 0x67617270)
              goto LAB_0013957f;
              cp_next((CPState *)ud);
              if (*(int *)((long)ud + 4) != 0x100) {
                if (*(int *)((long)ud + 4) == 0x103) goto LAB_00139424;
LAB_00139480:
                do {
                  if (*(int *)((long)ud + 0x58) != hashline) break;
                  cp_next((CPState *)ud);
                } while (*(int *)((long)ud + 4) != 0x103);
                goto LAB_00139424;
              }
              if ((*(int *)(*(long *)((long)ud + 0x10) + 0xc) != 4) ||
                 (*(int *)(*(long *)((long)ud + 0x10) + 0x10) != 0x6b636170)) goto LAB_00139480;
              cp_next((CPState *)ud);
              cp_check((CPState *)ud,0x28);
              iVar7 = *(int *)((long)ud + 4);
              if (iVar7 != 0x100) {
LAB_00139535:
                if (iVar7 == 0x102) {
                  uVar5 = *(uint *)((long)ud + 8);
                  iVar7 = 0x1f;
                  if (uVar5 != 0) {
                    for (; uVar5 >> iVar7 == 0; iVar7 = iVar7 + -1) {
                    }
                  }
                  uVar3 = (undefined1)iVar7;
                  if (uVar5 == 0) {
                    uVar3 = 0;
                  }
                  *(undefined1 *)((long)ud + (ulong)*(byte *)((long)ud + 0x6f) + 0x68) = uVar3;
                  cp_next((CPState *)ud);
                }
                else {
                  *(undefined1 *)((long)ud + (ulong)*(byte *)((long)ud + 0x6f) + 0x68) = 0xff;
                }
LAB_00139560:
                cp_check((CPState *)ud,0x29);
                goto LAB_00139424;
              }
              lVar2 = *(long *)((long)ud + 0x10);
              if (*(int *)(lVar2 + 0xc) == 3) {
                if (*(char *)(lVar2 + 0x12) == 'p' && *(short *)(lVar2 + 0x10) == 0x6f70) {
                  if (*(char *)((long)ud + 0x6f) != '\0') {
                    cVar4 = *(char *)((long)ud + 0x6f) + -1;
                    goto LAB_00139519;
                  }
                  goto LAB_0013951c;
                }
              }
              else if ((*(int *)(lVar2 + 0xc) == 4) && (*(int *)(lVar2 + 0x10) == 0x68737570)) {
                uVar10 = (ulong)*(byte *)((long)ud + 0x6f);
                if (5 < uVar10) {
                  CVar8 = 0x100;
                  em = LJ_ERR_XLEVELS;
                  goto LAB_0013958a;
                }
                *(undefined1 *)((long)ud + uVar10 + 0x69) =
                     *(undefined1 *)((long)ud + uVar10 + 0x68);
                cVar4 = *(char *)((long)ud + 0x6f) + '\x01';
LAB_00139519:
                *(char *)((long)ud + 0x6f) = cVar4;
LAB_0013951c:
                cp_next((CPState *)ud);
                if (*(int *)((long)ud + 4) == 0x2c) {
                  cp_next((CPState *)ud);
                  iVar7 = *(int *)((long)ud + 4);
                  goto LAB_00139535;
                }
                goto LAB_00139560;
              }
              CVar8 = 0x100;
            }
            else {
              if ((*(int *)(lVar2 + 0xc) == 4) && (*(int *)(lVar2 + 0x10) == 0x656e696c)) {
                CVar8 = cp_next((CPState *)ud);
                if (CVar8 != 0x102) {
                  cp_err_token((CPState *)ud,0x100);
                }
                goto LAB_0013941a;
              }
LAB_0013957f:
              CVar8 = *(CPToken *)((long)ud + 4);
            }
            em = LJ_ERR_XSYMBOL;
LAB_0013958a:
            cp_errmsg((CPState *)ud,CVar8,em);
          }
          if (CVar8 != 0x102) goto LAB_0013957f;
LAB_0013941a:
          cp_line((CPState *)ud,hashline);
        }
        else {
          if (iVar7 == 0x3b) {
            cp_next((CPState *)ud);
          }
          else {
            local_6bc = iVar12;
            CVar9 = cp_decl_spec((CPState *)ud,&local_6b0,0x38000);
            iVar7 = *(int *)((long)ud + 4);
            if ((((iVar7 != 0x103) && (iVar7 != 0x3b)) ||
                ((local_6b0.stack[0].info & 0xf0000000) != 0x70000000)) ||
               (((*(uint *)(**(long **)((long)ud + 0x40) +
                           (ulong)((local_6b0.stack[0].info & 0xffff) << 4)) >> 0x1c) - 1 &
                0xfffffffb) != 0)) {
              do {
                cp_declarator((CPState *)ud,&local_6b0);
                CVar6 = cp_decl_intern((CPState *)ud,&local_6b0);
                if ((local_6b0.name != (GCstr *)0x0) && (local_6b0.nameid == 0)) {
                  cts = *(CTState **)((long)ud + 0x40);
                  if ((short)CVar9 < 0) {
                    id = lj_ctype_new(cts,&local_6c8);
                    local_6c8->info = CVar6 + 0x70000000;
                  }
                  else {
                    if ((cts->tab[CVar6].info & 0xf0000000) == 0x60000000) {
                      local_6c8 = cts->tab + CVar6;
                      id = CVar6;
                    }
                    else {
                      if ((CVar9 >> 0x11 & 1) != 0) {
                        id = cp_decl_constinit((CPState *)ud,&local_6c8,CVar6);
                        goto LAB_00139394;
                      }
                      id = lj_ctype_new(cts,&local_6c8);
                      local_6c8->info = CVar6 + 0xc0000000;
                    }
                    if (local_6b0.redir != (GCstr *)0x0) {
                      CVar6 = lj_ctype_new(*(CTState **)((long)ud + 0x40),&local_6b8);
                      lVar2 = **(long **)((long)ud + 0x40);
                      lVar11 = (ulong)id * 0x10;
                      local_6c8 = (CType *)(lVar2 + lVar11);
                      local_6b8->info = 0x80040000;
                      local_6b8->sib = *(CTypeID1 *)(lVar2 + 8 + lVar11);
                      *(short *)(lVar2 + 8 + lVar11) = (short)CVar6;
                      (local_6b0.redir)->marked = (local_6b0.redir)->marked | 0x20;
                      (local_6b8->name).gcptr32 = (uint32_t)local_6b0.redir;
                    }
                  }
LAB_00139394:
                  (local_6b0.name)->marked = (local_6b0.name)->marked | 0x20;
                  (local_6c8->name).gcptr32 = (uint32_t)local_6b0.name;
                  lj_ctype_addname(*(CTState **)((long)ud + 0x40),local_6c8,id);
                }
                iVar7 = *(int *)((long)ud + 4);
                if (iVar7 != 0x2c) break;
                cp_next((CPState *)ud);
                local_6b0.pos = local_6b0.specpos;
                local_6b0.top = local_6b0.specpos + 1;
                local_6b0.stack[local_6b0.specpos].next = 0;
                local_6b0.attr = local_6b0.specattr;
                local_6b0.fattr = local_6b0.specfattr;
                local_6b0.name = (GCstr *)0x0;
                local_6b0.redir = (GCstr *)0x0;
              } while( true );
            }
            if (local_6bc != 0 && iVar7 == 0x103) break;
            cp_check((CPState *)ud,0x3b);
          }
          iVar12 = 0;
        }
LAB_00139424:
        iVar7 = *(int *)((long)ud + 4);
      } while (iVar7 != 0x103);
    }
  }
  if ((*(long *)((long)ud + 0x48) != 0) &&
     (*(long *)((long)ud + 0x48) != *(long *)(*(long *)((long)ud + 0x38) + 0x18))) {
    cp_err((CPState *)ud,LJ_ERR_FFI_NUMPARAM);
  }
  return (TValue *)0x0;
}

Assistant:

static TValue *cpcparser(lua_State *L, lua_CFunction dummy, void *ud)
{
  CPState *cp = (CPState *)ud;
  UNUSED(dummy);
  cframe_errfunc(L->cframe) = -1;  /* Inherit error function. */
  cp_init(cp);
  if ((cp->mode & CPARSE_MODE_MULTI))
    cp_decl_multi(cp);
  else
    cp_decl_single(cp);
  if (cp->param && cp->param != cp->L->top)
    cp_err(cp, LJ_ERR_FFI_NUMPARAM);
  lj_assertCP(cp->depth == 0, "unbalanced cparser declaration depth");
  return NULL;
}